

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.cpp
# Opt level: O2

void __thiscall duckdb::BinarySerializer::WriteValue(BinarySerializer *this,char *value)

{
  uint value_00;
  size_t val;
  
  val = strlen(value);
  value_00 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
  VarIntEncode<unsigned_int>(this,value_00);
  (**this->stream->_vptr_WriteStream)(this->stream,value,(ulong)value_00);
  return;
}

Assistant:

void BinarySerializer::WriteValue(const char *value) {
	auto len = NumericCast<uint32_t>(strlen(value));
	VarIntEncode(len);
	WriteData(value, len);
}